

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crossover.cc
# Opt level: O3

Int __thiscall
ipx::Crossover::PrimalRatioTest
          (Crossover *this,Vector *xbasic,IndexedVector *ftran,Vector *lbbasic,Vector *ubbasic,
          double step,double feastol,bool *block_at_lb)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  Int IVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  
  *block_at_lb = true;
  bVar8 = IndexedVector::sparse(ftran);
  if (bVar8) {
    iVar10 = ftran->nnz_;
    if ((long)iVar10 < 1) {
      return -1;
    }
    piVar3 = (ftran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (ftran->elements_)._M_data;
    pdVar5 = xbasic->_M_data;
    pdVar6 = lbbasic->_M_data;
    pdVar7 = ubbasic->_M_data;
    iVar9 = -1;
    lVar14 = 0;
    do {
      iVar2 = piVar3[lVar14];
      dVar15 = pdVar4[iVar2];
      if (1e-05 < ABS(dVar15)) {
        dVar1 = pdVar5[iVar2];
        dVar16 = step * dVar15 + dVar1;
        if (dVar16 < pdVar6[iVar2] - feastol) {
          step = ((pdVar6[iVar2] - dVar1) - feastol) / dVar15;
          *block_at_lb = true;
          dVar16 = step * dVar15 + dVar1;
          iVar9 = iVar2;
        }
        if (pdVar7[iVar2] + feastol < dVar16) {
          step = ((pdVar7[iVar2] - dVar1) + feastol) / dVar15;
          *block_at_lb = false;
          iVar9 = iVar2;
        }
      }
      lVar14 = lVar14 + 1;
    } while (iVar10 != lVar14);
  }
  else {
    uVar12 = (uint)(ftran->elements_)._M_size;
    if ((int)uVar12 < 1) {
      return -1;
    }
    pdVar4 = (ftran->elements_)._M_data;
    pdVar5 = xbasic->_M_data;
    pdVar6 = lbbasic->_M_data;
    pdVar7 = ubbasic->_M_data;
    iVar9 = -1;
    uVar13 = 0;
    do {
      dVar15 = pdVar4[uVar13];
      if (1e-05 < ABS(dVar15)) {
        dVar1 = pdVar5[uVar13];
        dVar16 = step * dVar15 + dVar1;
        if (dVar16 < pdVar6[uVar13] - feastol) {
          step = ((pdVar6[uVar13] - dVar1) - feastol) / dVar15;
          *block_at_lb = true;
          dVar16 = step * dVar15 + dVar1;
          iVar9 = (int)uVar13;
        }
        if (pdVar7[uVar13] + feastol < dVar16) {
          step = ((pdVar7[uVar13] - dVar1) + feastol) / dVar15;
          *block_at_lb = false;
          iVar9 = (int)uVar13;
        }
      }
      uVar13 = uVar13 + 1;
    } while ((uVar12 & 0x7fffffff) != uVar13);
  }
  if (-1 < iVar9) {
    bVar8 = IndexedVector::sparse(ftran);
    if (bVar8) {
      iVar9 = ftran->nnz_;
      if (0 < (long)iVar9) {
        piVar3 = (ftran->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (ftran->elements_)._M_data;
        pdVar5 = lbbasic->_M_data;
        pdVar6 = xbasic->_M_data;
        pdVar7 = ubbasic->_M_data;
        dVar15 = 1e-05;
        iVar10 = -1;
        lVar14 = 0;
        do {
          iVar2 = piVar3[lVar14];
          dVar1 = pdVar4[iVar2];
          dVar16 = ABS(dVar1);
          if (dVar15 < dVar16) {
            if ((step * dVar1 < 0.0) && (ABS((pdVar5[iVar2] - pdVar6[iVar2]) / dVar1) <= ABS(step)))
            {
              *block_at_lb = true;
              dVar15 = dVar16;
              iVar10 = iVar2;
            }
            if ((0.0 < step * dVar1) && (ABS((pdVar7[iVar2] - pdVar6[iVar2]) / dVar1) <= ABS(step)))
            {
              *block_at_lb = false;
              dVar15 = dVar16;
              iVar10 = iVar2;
            }
          }
          lVar14 = lVar14 + 1;
        } while (iVar9 != lVar14);
        return iVar10;
      }
    }
    else {
      uVar12 = (uint)(ftran->elements_)._M_size;
      if (0 < (int)uVar12) {
        pdVar4 = (ftran->elements_)._M_data;
        pdVar5 = lbbasic->_M_data;
        pdVar6 = xbasic->_M_data;
        pdVar7 = ubbasic->_M_data;
        dVar15 = 1e-05;
        IVar11 = -1;
        uVar13 = 0;
        do {
          dVar1 = pdVar4[uVar13];
          dVar16 = ABS(dVar1);
          if (dVar15 < dVar16) {
            if ((step * dVar1 < 0.0) &&
               (ABS((pdVar5[uVar13] - pdVar6[uVar13]) / dVar1) <= ABS(step))) {
              *block_at_lb = true;
              dVar15 = dVar16;
              IVar11 = (Int)uVar13;
            }
            if ((0.0 < step * dVar1) &&
               (ABS((pdVar7[uVar13] - pdVar6[uVar13]) / dVar1) <= ABS(step))) {
              *block_at_lb = false;
              dVar15 = dVar16;
              IVar11 = (Int)uVar13;
            }
          }
          uVar13 = uVar13 + 1;
        } while ((uVar12 & 0x7fffffff) != uVar13);
        return IVar11;
      }
    }
    return -1;
  }
  return iVar9;
}

Assistant:

Int Crossover::PrimalRatioTest(const Vector& xbasic, const IndexedVector& ftran,
                               const Vector& lbbasic, const Vector& ubbasic,
                               double step, double feastol, bool* block_at_lb) {
    Int pblock = -1;            // return value
    *block_at_lb = true;

    // First pass: determine maximum step size exploiting feasibility tol.
    auto update_step = [&](Int p, double pivot) {
        if (std::abs(pivot) > kPivotZeroTol) {
            // test block at lower bound
            if (xbasic[p] + step*pivot < lbbasic[p]-feastol) {
                step = (lbbasic[p]-xbasic[p]-feastol) / pivot;
                pblock = p;
                *block_at_lb = true;
            }
            // test block at upper bound
            if (xbasic[p] + step*pivot > ubbasic[p]+feastol) {
                step = (ubbasic[p]-xbasic[p]+feastol) / pivot;
                pblock = p;
                *block_at_lb = false;
            }
        }
    };
    for_each_nonzero(ftran, update_step);

    // If the step was not blocked, we are done.
    if (pblock < 0)
        return pblock;

    // Second pass: choose maximum pivot among all that block within step.
    pblock = -1;
    double max_pivot = kPivotZeroTol;
    auto update_max = [&](Int p, double pivot) {
        if (std::abs(pivot) > max_pivot) {
            // test block at lower bound
            if (step*pivot < 0.0) {
                double step_p = (lbbasic[p]-xbasic[p]) / pivot;
                if (std::abs(step_p) <= std::abs(step)) {
                    pblock = p;
                    *block_at_lb = true;
                    max_pivot = std::abs(pivot);
                }
            }
            // test block at upper bound
            if (step*pivot > 0.0) {
                double step_p = (ubbasic[p]-xbasic[p]) / pivot;
                if (std::abs(step_p) <= std::abs(step)) {
                    pblock = p;
                    *block_at_lb = false;
                    max_pivot = std::abs(pivot);
                }
            }
        }
    };
    for_each_nonzero(ftran, update_max);
    assert(pblock >= 0);
    return pblock;
}